

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

uint embree::Texture::getFormatBytesPerTexel(Format format)

{
  runtime_error *this;
  int in_EDI;
  uint local_4;
  
  if (in_EDI == 1) {
    local_4 = 4;
  }
  else if (in_EDI == 2) {
    local_4 = 3;
  }
  else {
    if (in_EDI != 3) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"invalid texture format");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_4 = 4;
  }
  return local_4;
}

Assistant:

unsigned Texture::getFormatBytesPerTexel(const Format format)
  {
    switch (format) {
    case RGBA8  : return 4;
    case RGB8   : return 3;
    case FLOAT32: return 4;
    default     : THROW_RUNTIME_ERROR("invalid texture format");
    }
  }